

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::destroy
          (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  SocketAddress *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if (((this->result).value.ptr.isSet == true) &&
     (pSVar1 = (this->result).value.ptr.field_1.value.ptr, pSVar1 != (SocketAddress *)0x0)) {
    sVar2 = (this->result).value.ptr.field_1.value.size_;
    (this->result).value.ptr.field_1.value.ptr = (SocketAddress *)0x0;
    (this->result).value.ptr.field_1.value.size_ = 0;
    pAVar3 = (this->result).value.ptr.field_1.value.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pSVar1,0x88,sVar2,sVar2,0);
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }